

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall CMU462::StaticScene::Mesh::Mesh(Mesh *this,HalfedgeMesh *mesh,BSDF *bsdf)

{
  value_type pVVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  mapped_type mVar5;
  VertexCIter VVar6;
  bool bVar7;
  ulong uVar8;
  Vector3D *pVVar9;
  reference ppVVar10;
  pointer this_00;
  pointer pHVar11;
  mapped_type *pmVar12;
  Vector3D *local_260;
  Vector3D *local_230;
  _List_const_iterator<CMU462::Halfedge> local_1d8;
  _List_const_iterator<CMU462::Halfedge> local_1d0;
  _List_const_iterator<CMU462::Vertex> local_1c8;
  reference local_1c0;
  value_type_conflict1 local_1b8;
  _List_const_iterator<CMU462::Halfedge> local_1b0;
  _List_const_iterator<CMU462::Vertex> local_1a8;
  reference local_1a0;
  value_type_conflict1 local_198;
  _List_const_iterator<CMU462::Vertex> local_190;
  reference local_188;
  value_type_conflict1 local_180;
  _List_const_iterator<CMU462::Halfedge> local_178;
  HalfedgeCIter h;
  _List_const_iterator<CMU462::Face> local_168;
  iterator local_160;
  _List_const_iterator<CMU462::Face> local_158;
  FaceCIter f;
  double local_148;
  double local_140;
  int local_134;
  int i;
  reference local_128;
  Vertex *v;
  _List_const_iterator<CMU462::Vertex> local_118;
  iterator local_110;
  _List_const_iterator<CMU462::Vertex> local_108;
  VertexCIter it;
  size_t vertexI;
  vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_> verts;
  unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
  vertexLabels;
  undefined1 local_98 [8];
  HalfedgeMesh _mesh;
  BSDF *bsdf_local;
  HalfedgeMesh *mesh_local;
  Mesh *this_local;
  
  _mesh.boundaries.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  _M_size = (size_t)bsdf;
  SceneObject::SceneObject(&this->super_SceneObject);
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_get_primitives_003949b0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->indices);
  HalfedgeMesh::HalfedgeMesh((HalfedgeMesh *)local_98,mesh);
  HalfedgeMesh::triangulate((HalfedgeMesh *)local_98);
  std::
  unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
  ::unordered_map((unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
                   *)&verts.
                      super__Vector_base<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>::vector
            ((vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_> *)&vertexI);
  it._M_node = (_List_node_base *)0x0;
  local_110._M_node = (_List_node_base *)HalfedgeMesh::verticesBegin((HalfedgeMesh *)local_98);
  std::_List_const_iterator<CMU462::Vertex>::_List_const_iterator(&local_108,&local_110);
  while( true ) {
    v = (Vertex *)HalfedgeMesh::verticesEnd((HalfedgeMesh *)local_98);
    std::_List_const_iterator<CMU462::Vertex>::_List_const_iterator(&local_118,(iterator *)&v);
    bVar7 = std::operator!=(&local_108,&local_118);
    VVar6 = it;
    if (!bVar7) break;
    local_128 = std::_List_const_iterator<CMU462::Vertex>::operator*(&local_108);
    std::vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>::push_back
              ((vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_> *)&vertexI,
               &local_128);
    mVar5 = (mapped_type)it._M_node;
    pmVar12 = std::
              unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
              ::operator[]((unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
                            *)&verts.
                               super__Vector_base<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_128);
    *pmVar12 = mVar5;
    it._M_node = (_List_node_base *)((long)&(it._M_node)->_M_next + 1);
    std::_List_const_iterator<CMU462::Vertex>::operator++(&local_108,0);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = it._M_node;
  uVar8 = SUB168(auVar2 * ZEXT816(0x18),0);
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pVVar9 = (Vector3D *)operator_new__(uVar8);
  if (VVar6._M_node != (_List_node_base *)0x0) {
    local_230 = pVVar9;
    do {
      Vector3D::Vector3D(local_230);
      local_230 = local_230 + 1;
    } while (local_230 != pVVar9 + (long)VVar6._M_node);
  }
  VVar6._M_node = it._M_node;
  this->positions = pVVar9;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = it._M_node;
  uVar8 = SUB168(auVar3 * ZEXT816(0x18),0);
  if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pVVar9 = (Vector3D *)operator_new__(uVar8);
  if (VVar6._M_node != (_List_node_base *)0x0) {
    local_260 = pVVar9;
    do {
      Vector3D::Vector3D(local_260);
      local_260 = local_260 + 1;
    } while (local_260 != pVVar9 + (long)VVar6._M_node);
  }
  this->normals = pVVar9;
  for (local_134 = 0; (_List_node_base *)(long)local_134 < it._M_node; local_134 = local_134 + 1) {
    ppVVar10 = std::vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>::
               operator[]((vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_> *
                          )&vertexI,(long)local_134);
    pVVar1 = *ppVVar10;
    pVVar9 = this->positions;
    pVVar9[local_134].z = (pVVar1->position).z;
    dVar4 = (pVVar1->position).y;
    pVVar9 = pVVar9 + local_134;
    pVVar9->x = (pVVar1->position).x;
    pVVar9->y = dVar4;
    ppVVar10 = std::vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>::
               operator[]((vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_> *
                          )&vertexI,(long)local_134);
    Vertex::normal((Vector3D *)&f,*ppVVar10);
    pVVar9 = this->normals + local_134;
    pVVar9->x = (double)f._M_node;
    pVVar9->y = local_148;
    pVVar9->z = local_140;
  }
  local_160._M_node = (_List_node_base *)HalfedgeMesh::facesBegin((HalfedgeMesh *)local_98);
  std::_List_const_iterator<CMU462::Face>::_List_const_iterator(&local_158,&local_160);
  while( true ) {
    h._M_node = (_List_node_base *)HalfedgeMesh::facesEnd((HalfedgeMesh *)local_98);
    std::_List_const_iterator<CMU462::Face>::_List_const_iterator(&local_168,(iterator *)&h);
    bVar7 = std::operator!=(&local_158,&local_168);
    if (!bVar7) break;
    this_00 = std::_List_const_iterator<CMU462::Face>::operator->(&local_158);
    local_178._M_node = (_List_node_base *)Face::halfedge(this_00);
    pHVar11 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_178);
    local_190._M_node = (_List_node_base *)Halfedge::vertex(pHVar11);
    local_188 = std::_List_const_iterator<CMU462::Vertex>::operator*(&local_190);
    pmVar12 = std::
              unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
              ::operator[]((unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
                            *)&verts.
                               super__Vector_base<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_188);
    local_180 = (value_type_conflict1)*pmVar12;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->indices,&local_180)
    ;
    pHVar11 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_178);
    local_1b0._M_node = (_List_node_base *)Halfedge::next(pHVar11);
    pHVar11 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_1b0);
    local_1a8._M_node = (_List_node_base *)Halfedge::vertex(pHVar11);
    local_1a0 = std::_List_const_iterator<CMU462::Vertex>::operator*(&local_1a8);
    pmVar12 = std::
              unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
              ::operator[]((unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
                            *)&verts.
                               super__Vector_base<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1a0);
    local_198 = (value_type_conflict1)*pmVar12;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->indices,&local_198)
    ;
    pHVar11 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_178);
    local_1d8._M_node = (_List_node_base *)Halfedge::next(pHVar11);
    pHVar11 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_1d8);
    local_1d0._M_node = (_List_node_base *)Halfedge::next(pHVar11);
    pHVar11 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_1d0);
    local_1c8._M_node = (_List_node_base *)Halfedge::vertex(pHVar11);
    local_1c0 = std::_List_const_iterator<CMU462::Vertex>::operator*(&local_1c8);
    pmVar12 = std::
              unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
              ::operator[]((unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
                            *)&verts.
                               super__Vector_base<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1c0);
    local_1b8 = (value_type_conflict1)*pmVar12;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->indices,&local_1b8)
    ;
    std::_List_const_iterator<CMU462::Face>::operator++(&local_158,0);
  }
  this->bsdf = (BSDF *)_mesh.boundaries.
                       super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node
                       ._M_size;
  std::vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>::~vector
            ((vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_> *)&vertexI);
  std::
  unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
  ::~unordered_map((unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
                    *)&verts.
                       super__Vector_base<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  HalfedgeMesh::~HalfedgeMesh((HalfedgeMesh *)local_98);
  return;
}

Assistant:

Mesh::Mesh(const HalfedgeMesh& mesh, BSDF* bsdf) {

  // triangulate mesh before sending to visualization or render mode
  HalfedgeMesh _mesh(mesh);
  _mesh.triangulate();

  unordered_map<const Vertex *, int> vertexLabels;
  vector<const Vertex *> verts;

  size_t vertexI = 0;
  for (VertexCIter it = _mesh.verticesBegin(); it != _mesh.verticesEnd(); it++) {
    const Vertex *v = &*it;
    verts.push_back(v);
    vertexLabels[v] = vertexI;
    vertexI++;
  }

  positions = new Vector3D[vertexI];
  normals   = new Vector3D[vertexI];
  for (int i = 0; i < vertexI; i++) {
    positions[i] = verts[i]->position;
    normals[i]   = verts[i]->normal();
  }

  for (FaceCIter f = _mesh.facesBegin(); f != _mesh.facesEnd(); f++) {
    HalfedgeCIter h = f->halfedge();
    indices.push_back(vertexLabels[&*h->vertex()]);
    indices.push_back(vertexLabels[&*h->next()->vertex()]);
    indices.push_back(vertexLabels[&*h->next()->next()->vertex()]);
  }

  this->bsdf = bsdf;

}